

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int parse_schema_json_predicate
              (char *id,char **mod_name,int *mod_name_len,char **name,int *nam_len,char **value,
              int *val_len,int *has_predicate)

{
  ushort uVar1;
  ushort *puVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  char *pcVar18;
  
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x3f8,
                  "int parse_schema_json_predicate(const char *, const char **, int *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (mod_name != (char **)0x0) {
    *mod_name = (char *)0x0;
  }
  if (mod_name_len != (int *)0x0) {
    *mod_name_len = 0;
  }
  if (name != (char **)0x0) {
    *name = (char *)0x0;
  }
  if (nam_len != (int *)0x0) {
    *nam_len = 0;
  }
  if (value != (char **)0x0) {
    *value = (char *)0x0;
  }
  if (val_len != (int *)0x0) {
    *val_len = 0;
  }
  if (has_predicate != (int *)0x0) {
    *has_predicate = 0;
  }
  if (*id != '[') {
    return 0;
  }
  ppuVar5 = __ctype_b_loc();
  lVar16 = 0;
  do {
    lVar17 = lVar16;
    cVar10 = id[lVar17 + 1];
    uVar1 = (*ppuVar5)[cVar10];
    lVar16 = lVar17 + 1;
  } while ((uVar1 >> 0xd & 1) != 0);
  pcVar9 = id + lVar16;
  if (cVar10 == '.') {
    if (name != (char **)0x0) {
      *name = pcVar9;
    }
    uVar12 = 1;
LAB_00111aaa:
    if (nam_len != (int *)0x0) {
      *nam_len = (int)uVar12;
    }
  }
  else {
    if ((uVar1 >> 0xb & 1) != 0) {
      if (cVar10 == '0') {
        return -(int)lVar16;
      }
      uVar12 = 0;
      do {
        lVar15 = lVar17 + 2 + uVar12;
        uVar12 = uVar12 + 1;
      } while ((*(byte *)((long)*ppuVar5 + (long)id[lVar15] * 2 + 1) & 8) != 0);
      if (name != (char **)0x0) {
        *name = pcVar9;
      }
      goto LAB_00111aaa;
    }
    uVar3 = parse_node_identifier(pcVar9,mod_name,mod_name_len,name,nam_len,(int *)0x0,0);
    uVar12 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      return uVar3 - (int)lVar16;
    }
  }
  uVar12 = uVar12 & 0xffffffff;
  uVar13 = uVar12 + lVar16;
  puVar2 = *ppuVar5;
  cVar10 = id[uVar13];
  if ((*(byte *)((long)puVar2 + (long)cVar10 * 2 + 1) & 0x20) == 0) {
    pcVar9 = id + uVar13;
  }
  else {
    do {
      uVar13 = (ulong)((int)uVar13 + 1);
      cVar10 = id[lVar17 + 2 + uVar12];
      uVar12 = uVar12 + 1;
    } while ((*(byte *)((long)puVar2 + (long)cVar10 * 2 + 1) & 0x20) != 0);
    pcVar9 = pcVar9 + uVar12;
  }
  iVar11 = (int)uVar13;
  if (cVar10 == '=') {
    if ((name != (char **)0x0) && ((*(byte *)((long)puVar2 + (long)**name * 2 + 1) & 8) != 0))
    goto LAB_00111cb7;
    iVar7 = -(uint)pcVar9;
    lVar17 = 0;
    lVar16 = 0;
    pcVar18 = pcVar9 + 1;
    iVar8 = iVar7;
    do {
      lVar15 = lVar16;
      cVar10 = (pcVar9 + 1)[lVar15];
      iVar8 = iVar8 + -1;
      lVar17 = lVar17 + -1;
      pcVar18 = pcVar18 + 1;
      lVar16 = lVar15 + 1;
    } while ((*(byte *)((long)puVar2 + (long)cVar10 * 2 + 1) & 0x20) != 0);
    iVar14 = (int)(lVar15 + 1);
    if ((cVar10 != '\'') && (cVar10 != '\"')) {
      iVar11 = iVar11 + iVar14;
      goto LAB_00111cb7;
    }
    pcVar6 = strchr(pcVar9 + lVar15 + 2,(int)cVar10);
    if (pcVar6 == (char *)0x0) {
      return ~(iVar11 + iVar14);
    }
    if (value != (char **)0x0) {
      *value = pcVar9 + lVar15 + 2;
    }
    iVar4 = (int)pcVar6;
    if (val_len != (int *)0x0) {
      *val_len = (iVar4 + ~(uint)pcVar9) - iVar14;
    }
    iVar11 = iVar11 + 1 + iVar4 + iVar7;
    if ((*(byte *)((long)*ppuVar5 + (long)pcVar18[iVar8 + iVar4] * 2 + 1) & 0x20) == 0) {
      pcVar9 = pcVar9 + ((iVar8 + iVar4) - lVar17) + 1;
    }
    else {
      pcVar9 = pcVar9 + lVar15 + 2;
      do {
        iVar11 = iVar11 + 1;
        pcVar18 = pcVar9 + (long)((iVar4 + iVar7) - iVar14) + 1;
        pcVar9 = pcVar9 + 1;
      } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar18 * 2 + 1) & 0x20) != 0);
      pcVar9 = pcVar9 + ((iVar7 + iVar4) - iVar14);
    }
  }
  if (*pcVar9 == ']') {
    iVar11 = iVar11 + 1;
    if (has_predicate == (int *)0x0) {
      return iVar11;
    }
    if (pcVar9[1] != '[') {
      return iVar11;
    }
    *has_predicate = 1;
    return iVar11;
  }
LAB_00111cb7:
  return -iVar11;
}

Assistant:

int
parse_schema_json_predicate(const char *id, const char **mod_name, int *mod_name_len, const char **name, int *nam_len,
                            const char **value, int *val_len, int *has_predicate)
{
    const char *ptr;
    int parsed = 0, ret;
    char quote;

    assert(id);
    if (mod_name) {
        *mod_name = NULL;
    }
    if (mod_name_len) {
        *mod_name_len = 0;
    }
    if (name) {
        *name = NULL;
    }
    if (nam_len) {
        *nam_len = 0;
    }
    if (value) {
        *value = NULL;
    }
    if (val_len) {
        *val_len = 0;
    }
    if (has_predicate) {
        *has_predicate = 0;
    }

    if (id[0] != '[') {
        return -parsed;
    }

    ++parsed;
    ++id;

    while (isspace(id[0])) {
        ++parsed;
        ++id;
    }

    /* identifier */
    if (id[0] == '.') {
        ret = 1;

        if (name) {
            *name = id;
        }
        if (nam_len) {
            *nam_len = ret;
        }
    } else if (isdigit(id[0])) {
        if (id[0] == '0') {
            return -parsed;
        }
        ret = 1;
        while (isdigit(id[ret])) {
            ++ret;
        }

        if (name) {
            *name = id;
        }
        if (nam_len) {
            *nam_len = ret;
        }
    } else if ((ret = parse_node_identifier(id, mod_name, mod_name_len, name, nam_len, NULL, 0)) < 1) {
        return -parsed + ret;
    }

    parsed += ret;
    id += ret;

    while (isspace(id[0])) {
        ++parsed;
        ++id;
    }

    /* there is value as well */
    if (id[0] == '=') {
        if (name && isdigit(**name)) {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        /* ((DQUOTE string DQUOTE) / (SQUOTE string SQUOTE)) */
        if ((id[0] == '\"') || (id[0] == '\'')) {
            quote = id[0];

            ++parsed;
            ++id;

            if ((ptr = strchr(id, quote)) == NULL) {
                return -parsed;
            }
            ret = ptr - id;

            if (value) {
                *value = id;
            }
            if (val_len) {
                *val_len = ret;
            }

            parsed += ret + 1;
            id += ret + 1;
        } else {
            return -parsed;
        }

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    if (id[0] != ']') {
        return -parsed;
    }

    ++parsed;
    ++id;

    if ((id[0] == '[') && has_predicate) {
        *has_predicate = 1;
    }

    return parsed;
}